

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codec.cpp
# Opt level: O1

void CodeSpectralEnvelope
               (double **spectrogram,int f0_length,int fs,int fft_size,int number_of_dimensions,
               double **coded_spectral_envelope)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  fft_plan p;
  uint x_length;
  double *xi;
  double *x;
  double *y;
  double *pdVar7;
  double *pdVar8;
  double *yi;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  fft_plan *pfVar13;
  ulong uVar14;
  long lVar15;
  undefined8 *puVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  uint fft_size_00;
  byte bVar20;
  double dVar21;
  double __x;
  double dVar22;
  ForwardRealFFT forward_real_fft;
  undefined8 auStackY_168 [5];
  undefined1 in_stack_fffffffffffffec0 [32];
  ulong uVar23;
  ForwardRealFFT local_98;
  
  bVar20 = 0;
  fft_size_00 = fft_size / 2;
  lVar10 = (long)(int)fft_size_00;
  uVar9 = lVar10 * 8;
  uVar17 = lVar10 << 4;
  uVar14 = uVar9;
  if (fft_size < -1) {
    uVar14 = 0xffffffffffffffff;
    uVar17 = 0xffffffffffffffff;
  }
  xi = (double *)operator_new__(uVar14);
  x_length = fft_size_00 + 1;
  uVar14 = lVar10 * 8 + 8;
  if (fft_size < -3) {
    uVar14 = 0xffffffffffffffff;
  }
  x = (double *)operator_new__(uVar14);
  y = (double *)operator_new__(uVar14);
  pdVar7 = (double *)operator_new__(uVar17);
  dVar21 = (double)fs;
  dVar2 = dVar21 * 0.5;
  if (20000.0 <= dVar2) {
    dVar2 = 20000.0;
  }
  dVar2 = log(dVar2 / 700.0 + 1.0);
  __x = (double)fft_size;
  uVar14 = (ulong)fft_size_00;
  if (1 < fft_size) {
    dVar3 = (double)(int)fft_size_00;
    pdVar8 = pdVar7 + 1;
    uVar17 = 0;
    dVar4 = SQRT(__x);
    do {
      xi[uVar17] = ((dVar2 * 1127.01048 + -62.62780462351186) * (double)(int)uVar17) / dVar3 +
                   62.62780462351186;
      dVar22 = ((double)(int)uVar17 * 3.141592653589793) / __x;
      dVar5 = cos(dVar22);
      dVar6 = dVar4;
      if (__x < 0.0) {
        dVar6 = sqrt(__x);
      }
      pdVar8[-1] = (dVar5 + dVar5) / dVar6;
      dVar22 = sin(dVar22);
      dVar5 = dVar4;
      if (__x < 0.0) {
        dVar5 = sqrt(__x);
      }
      *pdVar8 = (dVar22 + dVar22) / dVar5;
      uVar17 = uVar17 + 1;
      pdVar8 = pdVar8 + 2;
    } while (uVar14 != uVar17);
  }
  *pdVar7 = *pdVar7 / 1.4142135623730951;
  uVar17 = (ulong)x_length;
  if (-2 < fft_size) {
    uVar11 = 0;
    do {
      dVar2 = log((((double)(int)uVar11 * dVar21) / __x) / 700.0 + 1.0);
      x[uVar11] = dVar2 * 1127.01048;
      uVar11 = uVar11 + 1;
    } while (uVar17 != uVar11);
  }
  local_98.forward_fft.ip = (int *)0x0;
  local_98.forward_fft.w = (double *)0x0;
  local_98.forward_fft.out = (double *)0x0;
  local_98.forward_fft.input = (double *)0x0;
  local_98.forward_fft.in = (double *)0x0;
  local_98.forward_fft.c_out = (fft_complex *)0x0;
  local_98.forward_fft.flags = 0;
  local_98.forward_fft._12_4_ = 0;
  local_98.forward_fft.c_in = (fft_complex *)0x0;
  local_98.spectrum = (fft_complex *)0x0;
  local_98.forward_fft.n = 0;
  local_98.forward_fft.sign = 0;
  local_98.fft_size = 0;
  local_98._4_4_ = 0;
  local_98.waveform = (double *)0x0;
  InitializeForwardRealFFT(fft_size_00,&local_98);
  if (0 < f0_length) {
    if (fft_size < -1) {
      uVar9 = 0xffffffffffffffff;
    }
    uVar19 = (ulong)(uint)number_of_dimensions;
    lVar10 = (ulong)(fft_size_00 >> 1) << 4;
    pdVar8 = (double *)((ulong)(fft_size_00 >> 1) << 3);
    uVar11 = 0;
    do {
      uVar23 = uVar17;
      if (-2 < fft_size) {
        uVar18 = 0;
        do {
          dVar2 = log(spectrogram[uVar11][uVar18]);
          y[uVar18] = dVar2;
          uVar18 = uVar18 + 1;
        } while (uVar17 != uVar18);
      }
      uVar17 = uVar23;
      pdVar1 = coded_spectral_envelope[uVar11];
      yi = (double *)operator_new__(uVar9);
      interp1(x,y,x_length,xi,fft_size_00,yi);
      if (3 < fft_size) {
        lVar12 = 0;
        lVar15 = 0;
        do {
          *(undefined8 *)((long)local_98.waveform + lVar12) = *(undefined8 *)((long)yi + lVar12 * 2)
          ;
          *(undefined8 *)((long)pdVar8 + (long)local_98.waveform + lVar12) =
               *(undefined8 *)((long)yi + lVar15 + uVar14 * 8 + -8);
          lVar15 = lVar15 + -0x10;
          lVar12 = lVar12 + 8;
        } while (lVar10 + lVar15 != 0);
      }
      pfVar13 = &local_98.forward_fft;
      puVar16 = auStackY_168;
      for (lVar12 = 9; lVar12 != 0; lVar12 = lVar12 + -1) {
        *puVar16 = *(undefined8 *)pfVar13;
        pfVar13 = (fft_plan *)((long)pfVar13 + ((ulong)bVar20 * -2 + 1) * 8);
        puVar16 = puVar16 + (ulong)bVar20 * -2 + 1;
      }
      p.c_out._0_4_ = fft_size_00;
      p.n = in_stack_fffffffffffffec0._0_4_;
      p.sign = in_stack_fffffffffffffec0._4_4_;
      p.flags = in_stack_fffffffffffffec0._8_4_;
      p._12_4_ = in_stack_fffffffffffffec0._12_4_;
      p.c_in = (fft_complex *)in_stack_fffffffffffffec0._16_8_;
      p.in = (double *)in_stack_fffffffffffffec0._24_8_;
      p.c_out._4_4_ = fft_size;
      p.out = (double *)uVar17;
      p.input = (double *)lVar10;
      p.ip._0_4_ = number_of_dimensions;
      p.ip._4_4_ = x_length;
      p.w = pdVar8;
      fft_execute(p);
      dVar2 = (double)local_98.fft_size;
      if (dVar2 < 0.0) {
        dVar2 = sqrt(dVar2);
      }
      else {
        dVar2 = SQRT(dVar2);
      }
      if (0 < number_of_dimensions) {
        lVar12 = 0;
        do {
          *(double *)((long)pdVar1 + lVar12) =
               (*(double *)((long)*local_98.spectrum + lVar12 * 2) *
                *(double *)((long)pdVar7 + lVar12 * 2) -
               *(double *)((long)pdVar7 + lVar12 * 2 + 8) *
               *(double *)((long)*local_98.spectrum + lVar12 * 2 + 8)) / dVar2;
          lVar12 = lVar12 + 8;
        } while (uVar19 << 3 != lVar12);
      }
      operator_delete__(yi);
      uVar11 = uVar11 + 1;
    } while (uVar11 != (uint)f0_length);
  }
  DestroyForwardRealFFT(&local_98);
  operator_delete__(pdVar7);
  operator_delete__(y);
  operator_delete__(x);
  operator_delete__(xi);
  return;
}

Assistant:

void CodeSpectralEnvelope(const double * const *spectrogram, int f0_length,
    int fs, int fft_size, int number_of_dimensions,
    double **coded_spectral_envelope) {
  double *mel_axis = new double[fft_size / 2];
  double *frequency_axis = new double[fft_size / 2 + 1];
  double *tmp_spectrum = new double[fft_size / 2 + 1];
  fft_complex *weight = new fft_complex[fft_size / 2];

  // Generation of the required parameters
  GetParametersForCoding(world::kFloorFrequency,
      MyMinDouble(fs / 2.0, world::kCeilFrequency), fs, fft_size,
      mel_axis, frequency_axis, weight);

  ForwardRealFFT forward_real_fft = { 0 };
  InitializeForwardRealFFT(fft_size / 2, &forward_real_fft);

  for (int i = 0; i < f0_length; ++i) {
    for (int j = 0; j < fft_size / 2 + 1; ++j)
      tmp_spectrum[j] = log(spectrogram[i][j]);
    CodeOneFrame(tmp_spectrum, frequency_axis, fft_size, mel_axis, weight,
        fft_size / 2, number_of_dimensions, &forward_real_fft,
        coded_spectral_envelope[i]);
  }

  DestroyForwardRealFFT(&forward_real_fft);
  delete[] weight;
  delete[] tmp_spectrum;
  delete[] frequency_axis;
  delete[] mel_axis;
}